

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::_OnChangedVtxOffset(ImDrawList *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ImTextureID pvVar8;
  ImDrawCmd *pIVar9;
  ImDrawCmd *__dest;
  int iVar10;
  long lVar11;
  int iVar12;
  
  this->_VtxCurrentIdx = 0;
  pIVar9 = (this->CmdBuffer).Data;
  lVar11 = (long)(this->CmdBuffer).Size;
  if (pIVar9[lVar11 + -1].ElemCount != 0) {
    fVar1 = (this->_CmdHeader).ClipRect.x;
    fVar2 = (this->_CmdHeader).ClipRect.z;
    if (fVar1 <= fVar2) {
      fVar3 = (this->_CmdHeader).ClipRect.y;
      fVar4 = (this->_CmdHeader).ClipRect.w;
      if (fVar3 <= fVar4) {
        pvVar8 = (this->_CmdHeader).TextureId;
        uVar5 = (this->_CmdHeader).VtxOffset;
        uVar6 = (this->IdxBuffer).Size;
        iVar12 = (this->CmdBuffer).Size;
        iVar7 = (this->CmdBuffer).Capacity;
        if (iVar12 == iVar7) {
          iVar12 = iVar12 + 1;
          if (iVar7 == 0) {
            iVar10 = 8;
          }
          else {
            iVar10 = iVar7 / 2 + iVar7;
          }
          if (iVar12 < iVar10) {
            iVar12 = iVar10;
          }
          if (iVar7 < iVar12) {
            __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar12 * 0x38);
            pIVar9 = (this->CmdBuffer).Data;
            if (pIVar9 != (ImDrawCmd *)0x0) {
              memcpy(__dest,pIVar9,(long)(this->CmdBuffer).Size * 0x38);
              ImGui::MemFree((this->CmdBuffer).Data);
            }
            (this->CmdBuffer).Data = __dest;
            (this->CmdBuffer).Capacity = iVar12;
          }
        }
        pIVar9 = (this->CmdBuffer).Data;
        iVar12 = (this->CmdBuffer).Size;
        pIVar9[iVar12].ClipRect.x = fVar1;
        pIVar9[iVar12].ClipRect.y = fVar3;
        pIVar9[iVar12].ClipRect.z = fVar2;
        pIVar9[iVar12].ClipRect.w = fVar4;
        pIVar9[iVar12].TextureId = pvVar8;
        pIVar9[iVar12].VtxOffset = uVar5;
        pIVar9[iVar12].IdxOffset = uVar6;
        *(undefined8 *)&pIVar9[iVar12].ElemCount = 0;
        *(ImDrawCallback *)(&pIVar9[iVar12].ElemCount + 2) = (ImDrawCallback)0x0;
        pIVar9[iVar12].UserCallbackData = (void *)0x0;
        (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
        return;
      }
    }
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_draw.cpp"
                  ,0x1bc,"void ImDrawList::AddDrawCmd()");
  }
  if (pIVar9[lVar11 + -1].UserCallback == (ImDrawCallback)0x0) {
    pIVar9[lVar11 + -1].VtxOffset = (this->_CmdHeader).VtxOffset;
    return;
  }
  __assert_fail("curr_cmd->UserCallback == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_draw.cpp"
                ,0x218,"void ImDrawList::_OnChangedVtxOffset()");
}

Assistant:

void ImDrawList::_OnChangedVtxOffset()
{
    // We don't need to compare curr_cmd->VtxOffset != _CmdHeader.VtxOffset because we know it'll be different at the time we call this.
    _VtxCurrentIdx = 0;
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    //IM_ASSERT(curr_cmd->VtxOffset != _CmdHeader.VtxOffset); // See #3349
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    curr_cmd->VtxOffset = _CmdHeader.VtxOffset;
}